

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_2::DeepTiledInputFile,Imf_3_2::DeepTiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  DeepTiledOutputFile file;
  MultiPartInputFile file_1;
  Header f;
  long *local_88;
  long lStack_80;
  long local_78 [3];
  MultiPartInputFile local_60 [16];
  TileDescription local_50 [3];
  
  local_88 = (long *)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_50,0x40,0x40,1.0,(Vec2 *)&local_88,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_88,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012f19d;
    }
  }
  else {
LAB_0012f19d:
    Imf_3_2::Header::setType((string *)local_50);
  }
  puVar5 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar5 = 2;
  local_88 = (long *)0x2000000020;
  lStack_80 = 0;
  Imf_3_2::Header::setTileDescription(local_50);
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
            ((DeepTiledOutputFile *)&local_88,"/var/tmp/badfile.exr",(Header *)local_50,iVar3);
  Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile((DeepTiledOutputFile *)&local_88);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_60,"/var/tmp/badfile.exr",iVar3,true);
  if (DAT_001eee78 == DAT_001eeea0) {
    if (DAT_001eee78 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee78);
      if (iVar3 != 0) goto LAB_0012f252;
    }
  }
  else {
LAB_0012f252:
    Imf_3_2::MultiPartInputFile::header((int)local_60);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 == DAT_001eee78) {
      if (sVar1 != 0) {
        iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPTILE_abi_cxx11_,sVar1);
        if (iVar3 != 0) goto LAB_0012f293;
      }
    }
    else {
LAB_0012f293:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,Imf_3_2::DEEPTILE_abi_cxx11_,DAT_001eee78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
      Imf_3_2::MultiPartInputFile::header((int)local_60);
      puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001eeea0) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar3 != 0) goto LAB_0012f33e;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
      }
      else {
LAB_0012f33e:
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_88,lStack_80)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
    }
  }
  if (DAT_001eee78 == DAT_001eeea0) {
    if (DAT_001eee78 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee78);
      if (iVar3 != 0) goto LAB_0012f3fb;
    }
  }
  else {
LAB_0012f3fb:
    Imf_3_2::MultiPartInputFile::header((int)local_60);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 != DAT_001eee78) {
LAB_0012f6a7:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPTILE_abi_cxx11_,sVar1);
      if (iVar3 != 0) goto LAB_0012f6a7;
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_60);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)local_60,"/var/tmp/badfile.exr",iVar3);
  if (DAT_001eee78 == DAT_001eeea0) {
    if (DAT_001eee78 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee78);
      if (iVar3 != 0) goto LAB_0012f492;
    }
    Imf_3_2::DeepTiledInputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::DeepTiledInputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
    goto LAB_0012f67d;
  }
LAB_0012f492:
  Imf_3_2::DeepTiledInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar1 = puVar6[1];
  if (sVar1 == DAT_001eee78) {
    if (sVar1 == 0) goto LAB_0012f67d;
    iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPTILE_abi_cxx11_,sVar1);
    if (iVar3 == 0) goto LAB_0012f67d;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_2::DEEPTILE_abi_cxx11_,DAT_001eee78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_2::DeepTiledInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012f582;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
  }
  else {
LAB_0012f582:
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_88,lStack_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_0012f67d:
  Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)local_60);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header((Header *)local_50);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}